

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

Interval * __thiscall
tcu::FloatFormat::roundOut
          (Interval *__return_storage_ptr__,FloatFormat *this,Interval *x,bool roundUnderOverflow)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  __return_storage_ptr__->m_hasNaN = x->m_hasNaN;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar6 = x->m_lo;
  if (dVar6 < x->m_hi || dVar6 == x->m_hi) {
    dVar5 = roundOut(this,dVar6,false,roundUnderOverflow);
    dVar6 = INFINITY;
    if (!NAN(dVar5)) {
      dVar6 = dVar5;
    }
    dVar2 = (double)(-(ulong)NAN(dVar5) & 0xfff0000000000000 | ~-(ulong)NAN(dVar5) & (ulong)dVar5);
    dVar7 = roundOut(this,x->m_hi,true,roundUnderOverflow);
    dVar8 = INFINITY;
    if (!NAN(dVar7)) {
      dVar8 = dVar7;
    }
    dVar1 = (double)(-(ulong)NAN(dVar7) & 0xfff0000000000000 | ~-(ulong)NAN(dVar7) & (ulong)dVar7);
    dVar8 = (double)(~-(ulong)(dVar6 <= dVar8) & (ulong)dVar8 |
                    (ulong)dVar6 & -(ulong)(dVar6 <= dVar8));
    uVar3 = -(ulong)(dVar1 <= dVar2);
    dVar6 = (double)(~uVar3 & (ulong)dVar1 | uVar3 & (ulong)dVar2);
    uVar3 = -(ulong)(__return_storage_ptr__->m_lo <= dVar8);
    uVar4 = -(ulong)(dVar6 <= __return_storage_ptr__->m_hi);
    __return_storage_ptr__->m_hasNaN =
         (bool)(__return_storage_ptr__->m_hasNaN | (NAN(dVar5) || NAN(dVar7)));
    __return_storage_ptr__->m_lo =
         (double)(uVar3 & (ulong)__return_storage_ptr__->m_lo | ~uVar3 & (ulong)dVar8);
    __return_storage_ptr__->m_hi =
         (double)(uVar4 & (ulong)__return_storage_ptr__->m_hi | ~uVar4 & (ulong)dVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::roundOut (const Interval& x, bool roundUnderOverflow) const
{
	Interval ret = x.nan();

	if (!x.empty())
		ret |= Interval(roundOut(x.lo(), false, roundUnderOverflow),
						roundOut(x.hi(), true, roundUnderOverflow));

	return ret;
}